

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,char *newFlags)

{
  size_t sVar1;
  long *local_48 [2];
  long local_38 [2];
  
  if ((newFlags != (char *)0x0) && (*newFlags != '\0')) {
    local_48[0] = local_38;
    sVar1 = strlen(newFlags);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,newFlags,newFlags + sVar1);
    (*this->_vptr_cmLocalGenerator[6])(this,flags,local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const char* newFlags) const
{
  if (newFlags && *newFlags) {
    this->AppendFlags(flags, std::string(newFlags));
  }
}